

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncToString(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
               vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  StringLiteral *this;
  ExpressionValueType EVar1;
  pointer pEVar2;
  string *this_00;
  string sStack_78;
  string local_58;
  StringLiteral local_38;
  
  this_00 = &sStack_78;
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  this = &__return_storage_ptr__->strValue;
  pEVar2 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar1 = pEVar2->type;
  if (EVar1 == Integer) {
    tinyformat::format<long>(&local_58,"%d",&(pEVar2->field_1).intValue);
    StringLiteral::StringLiteral(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = &local_58;
  }
  else {
    if (EVar1 != Float) {
      if (EVar1 != String) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_assign((string *)this);
      goto LAB_0012a5ea;
    }
    tinyformat::format<double>(&sStack_78,"%#.17g",&(pEVar2->field_1).floatValue);
    StringLiteral::StringLiteral(&local_38,&sStack_78);
    std::__cxx11::string::operator=((string *)this,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0012a5ea:
  __return_storage_ptr__->type = String;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncToString(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::String:
		result.strValue = parameters[0].strValue;
		break;
	case ExpressionValueType::Integer:
		result.strValue = tfm::format("%d",parameters[0].intValue);
		break;
	case ExpressionValueType::Float:
		result.strValue = tfm::format("%#.17g",parameters[0].floatValue);
		break;
	default:
		return result;
	}

	result.type = ExpressionValueType::String;
	return result;
}